

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void opj_v4dwt_interleave_v
               (opj_v4dwt_t *dwt,OPJ_FLOAT32 *a,OPJ_UINT32 width,OPJ_UINT32 nb_elts_read)

{
  int iVar1;
  uint uVar2;
  opj_v4_t *poVar3;
  ulong uVar4;
  OPJ_FLOAT32 *pOVar5;
  ulong uVar6;
  ulong uVar7;
  
  poVar3 = dwt->wavelet;
  iVar1 = dwt->cas;
  uVar6 = (ulong)dwt->win_l_x0;
  uVar2 = dwt->win_l_x1;
  uVar4 = (ulong)width;
  uVar7 = uVar6 * 2;
  pOVar5 = a + uVar6 * uVar4;
  for (; uVar6 < uVar2; uVar6 = uVar6 + 1) {
    memcpy(poVar3 + (long)iVar1 + (uVar7 & 0xffffffff),pOVar5,(ulong)nb_elts_read << 2);
    uVar7 = uVar7 + 2;
    pOVar5 = pOVar5 + uVar4;
  }
  uVar6 = (ulong)dwt->win_h_x0;
  uVar2 = dwt->win_h_x1;
  uVar7 = uVar6 * 2;
  pOVar5 = (OPJ_FLOAT32 *)((long)a + ((ulong)(uint)dwt->sn * 4 + uVar6 * 4) * uVar4);
  for (; uVar6 < uVar2; uVar6 = uVar6 + 1) {
    memcpy(poVar3 + (((uVar7 & 0xffffffff) + 1) - (long)iVar1),pOVar5,(ulong)nb_elts_read << 2);
    uVar7 = uVar7 + 2;
    pOVar5 = pOVar5 + uVar4;
  }
  return;
}

Assistant:

static void opj_v4dwt_interleave_v(opj_v4dwt_t* OPJ_RESTRICT dwt,
                                   OPJ_FLOAT32* OPJ_RESTRICT a,
                                   OPJ_UINT32 width,
                                   OPJ_UINT32 nb_elts_read)
{
    opj_v4_t* OPJ_RESTRICT bi = dwt->wavelet + dwt->cas;
    OPJ_UINT32 i;

    for (i = dwt->win_l_x0; i < dwt->win_l_x1; ++i) {
        memcpy(&bi[i * 2], &a[i * (OPJ_SIZE_T)width],
               (OPJ_SIZE_T)nb_elts_read * sizeof(OPJ_FLOAT32));
    }

    a += (OPJ_UINT32)dwt->sn * (OPJ_SIZE_T)width;
    bi = dwt->wavelet + 1 - dwt->cas;

    for (i = dwt->win_h_x0; i < dwt->win_h_x1; ++i) {
        memcpy(&bi[i * 2], &a[i * (OPJ_SIZE_T)width],
               (OPJ_SIZE_T)nb_elts_read * sizeof(OPJ_FLOAT32));
    }
}